

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> * __thiscall
kj::Maybe<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::operator=
          (Maybe<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this)

{
  Maybe<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this_local;
  
  kj::_::NullableValue<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::operator=
            (&this->ptr,(void *)0x0);
  return this;
}

Assistant:

inline Maybe& operator=(kj::None) { ptr = nullptr; return *this; }